

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Vec3 *vectorArray,size_t length)

{
  long lVar1;
  size_t sVar2;
  GLfloat *pGVar3;
  bool bVar4;
  UniformBinder binder;
  vector<float,_std::allocator<float>_> contiguous;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&contiguous,length * 3,(allocator_type *)&binder);
  lVar1 = 8;
  sVar2 = length;
  while (bVar4 = sVar2 != 0, sVar2 = sVar2 - 1, bVar4) {
    *(undefined4 *)
     ((long)contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + lVar1 + -8) =
         *(undefined4 *)((long)vectorArray + lVar1 + -8);
    *(undefined4 *)
     ((long)contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + lVar1 + -4) =
         *(undefined4 *)((long)vectorArray + lVar1 + -4);
    *(undefined4 *)
     ((long)contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + lVar1) =
         *(undefined4 *)((long)&vectorArray->x + lVar1);
    lVar1 = lVar1 + 0xc;
  }
  UniformBinder::UniformBinder(&binder,this,name);
  if (binder.location != -1) {
    pGVar3 = (GLfloat *)0x0;
    if (contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      pGVar3 = contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    (*sf_glad_glUniform3fvARB)(binder.location,(GLsizei)length,pGVar3);
  }
  UniformBinder::~UniformBinder(&binder);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&contiguous.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Vec3* vectorArray, std::size_t length)
{
    std::vector<float> contiguous = flatten(vectorArray, length);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniform3fv(binder.location, static_cast<GLsizei>(length), !contiguous.empty() ? &contiguous[0] : NULL));
}